

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pe.cc
# Opt level: O2

void bloaty::pe::ParseSections(PeFile *pe,RangeSink *sink)

{
  ulong vmsize;
  size_t in_R8;
  size_t vmaddr;
  ulong n;
  string_view sVar1;
  string_view name;
  Section local_78;
  
  if (pe->ok_ != false) {
    for (n = 0; n < pe->section_count_; n = n + 1) {
      sVar1 = PeFile::section_header(pe,n);
      Section::Section(&local_78,sVar1);
      vmsize = (ulong)local_78.header_.VirtualSize;
      vmaddr = (size_t)local_78.header_.VirtualAddress;
      sVar1._M_str._0_4_ = local_78.header_.PointerToRawData;
      sVar1._M_len = (size_t)(pe->data_)._M_str;
      sVar1._M_str._4_4_ = 0;
      sVar1 = StrictSubstr((bloaty *)(pe->data_)._M_len,sVar1,(ulong)local_78.header_.SizeOfRawData,
                           in_R8);
      name._M_str = local_78.name._M_dataplus._M_p;
      name._M_len = local_78.name._M_string_length;
      RangeSink::AddRange(sink,"pe_sections",name,vmaddr,vmsize,sVar1);
      std::__cxx11::string::~string((string *)&local_78);
      in_R8 = vmaddr;
    }
    return;
  }
  __assert_fail("pe.IsOpen()",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/pe.cc",0xc0,
                "void bloaty::pe::ParseSections(const PeFile &, RangeSink *)");
}

Assistant:

void ParseSections(const PeFile& pe, RangeSink* sink) {
  assert(pe.IsOpen());
  ForEachSection(pe, [sink, &pe](const Section& section) {
    uint64_t vmaddr = section.virtual_addr();
    uint64_t vmsize = section.virtual_size();
    std::string_view section_data = StrictSubstr(
        pe.entire_file(), section.raw_offset(), section.raw_size());

    sink->AddRange("pe_sections", section.name, vmaddr, vmsize, section_data);
  });
}